

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall
FFont::BuildTranslations
          (FFont *this,double *luminosity,BYTE *identity,void *ranges,int total_colors,
          PalEntry *palette)

{
  BYTE BVar1;
  uint32 uVar2;
  FRemapTable *o;
  short *psVar3;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_94;
  int local_90;
  int local_8c;
  int b;
  int g;
  int r;
  int rangev;
  TranslationParm *parms;
  int v;
  undefined1 local_68 [8];
  FRemapTable remap;
  TranslationParm *parmstart;
  int j;
  int i;
  PalEntry *palette_local;
  int total_colors_local;
  void *ranges_local;
  BYTE *identity_local;
  double *luminosity_local;
  FFont *this_local;
  
  remap._24_8_ = ranges;
  FRemapTable::FRemapTable((FRemapTable *)local_68,total_colors);
  TArray<FRemapTable,_FRemapTable>::Clear(&this->Ranges);
  parmstart._4_4_ = 0;
  do {
    if (NumTextColors <= parmstart._4_4_) {
      FRemapTable::~FRemapTable((FRemapTable *)local_68);
      return;
    }
    if (parmstart._4_4_ == 0xb) {
      if (identity == (BYTE *)0x0) {
        o = TArray<FRemapTable,_FRemapTable>::operator[](&this->Ranges,0);
        FRemapTable::operator=((FRemapTable *)local_68,o);
      }
      else {
        memcpy((void *)local_68,identity,(long)this->ActiveColors);
        if (palette == (PalEntry *)0x0) {
          uVar2 = PalEntry::operator_cast_to_unsigned_int(GPalette.BaseColors + *identity);
          PalEntry::operator=((PalEntry *)remap.Remap,uVar2 & 0xffffff);
          for (parmstart._0_4_ = 1; (int)parmstart < this->ActiveColors;
              parmstart._0_4_ = (int)parmstart + 1) {
            uVar2 = PalEntry::operator_cast_to_unsigned_int
                              (GPalette.BaseColors + identity[(int)parmstart]);
            PalEntry::operator=((PalEntry *)(remap.Remap + (long)(int)parmstart * 4),
                                uVar2 | 0xff000000);
          }
        }
        else {
          memcpy(remap.Remap,palette,(long)this->ActiveColors << 2);
        }
      }
      TArray<FRemapTable,_FRemapTable>::Push(&this->Ranges,(FRemapTable *)local_68);
    }
    else {
      if (*(short *)remap._24_8_ < 0) {
        __assert_fail("parmstart->RangeStart >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                      ,0x2b8,
                      "void FFont::BuildTranslations(const double *, const BYTE *, const void *, int, const PalEntry *)"
                     );
      }
      *(BYTE *)local_68 = '\0';
      PalEntry::operator=((PalEntry *)remap.Remap,0);
      for (parmstart._0_4_ = 1; (int)parmstart < this->ActiveColors;
          parmstart._0_4_ = (int)parmstart + 1) {
        parms._0_4_ = (int)(luminosity[(int)parmstart] * 256.0);
        psVar3 = (short *)(remap._24_8_ + -10);
        do {
          _r = psVar3;
          psVar3 = _r + 5;
          if ((*psVar3 <= (int)parms) && ((int)parms <= _r[6])) break;
        } while (_r[6] < _r[10]);
        g = (((int)parms - *psVar3) * 0x100) / ((int)_r[6] - (int)*psVar3);
        b = (int)((uint)*(byte *)(_r + 7) * 0x100 +
                 g * ((uint)*(byte *)((long)_r + 0x11) - (uint)*(byte *)(_r + 7))) >> 8;
        local_8c = (int)((uint)*(byte *)((long)_r + 0xf) * 0x100 +
                        g * ((uint)*(byte *)(_r + 9) - (uint)*(byte *)((long)_r + 0xf))) >> 8;
        local_90 = (int)((uint)*(byte *)(_r + 8) * 0x100 +
                        g * ((uint)*(byte *)((long)_r + 0x13) - (uint)*(byte *)(_r + 8))) >> 8;
        _r = psVar3;
        b = clamp<int>(b,0,0xff);
        local_8c = clamp<int>(local_8c,0,0xff);
        local_90 = clamp<int>(local_90,0,0xff);
        BVar1 = FColorMatcher::Pick(&ColorMatcher,b,local_8c,local_90);
        *(BYTE *)((long)local_68 + (long)(int)parmstart) = BVar1;
        PalEntry::PalEntry((PalEntry *)&local_94.field_0,0xff,(BYTE)b,(BYTE)local_8c,(BYTE)local_90)
        ;
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)(remap.Remap + (long)(int)parmstart * 4) =
             local_94;
      }
      TArray<FRemapTable,_FRemapTable>::Push(&this->Ranges,(FRemapTable *)local_68);
      for (; *(short *)(remap._24_8_ + 2) < *(short *)(remap._24_8_ + 10);
          remap._24_8_ = remap._24_8_ + 10) {
      }
      remap._24_8_ = remap._24_8_ + 10;
    }
    parmstart._4_4_ = parmstart._4_4_ + 1;
  } while( true );
}

Assistant:

void FFont::BuildTranslations (const double *luminosity, const BYTE *identity,
							   const void *ranges, int total_colors, const PalEntry *palette)
{
	int i, j;
	const TranslationParm *parmstart = (const TranslationParm *)ranges;

	FRemapTable remap(total_colors);

	// Create different translations for different color ranges
	Ranges.Clear();
	for (i = 0; i < NumTextColors; i++)
	{
		if (i == CR_UNTRANSLATED)
		{
			if (identity != NULL)
			{
				memcpy (remap.Remap, identity, ActiveColors);
				if (palette != NULL)
				{
					memcpy (remap.Palette, palette, ActiveColors*sizeof(PalEntry));
				}
				else
				{
					remap.Palette[0] = GPalette.BaseColors[identity[0]] & MAKEARGB(0,255,255,255);
					for (j = 1; j < ActiveColors; ++j)
					{
						remap.Palette[j] = GPalette.BaseColors[identity[j]] | MAKEARGB(255,0,0,0);
					}
				}
			}
			else
			{
				remap = Ranges[0];
			}
			Ranges.Push(remap);
			continue;
		}

		assert(parmstart->RangeStart >= 0);

		remap.Remap[0] = 0;
		remap.Palette[0] = 0;

		for (j = 1; j < ActiveColors; j++)
		{
			int v = int(luminosity[j] * 256.0);

			// Find the color range that this luminosity value lies within.
			const TranslationParm *parms = parmstart - 1;
			do
			{
				parms++;
				if (parms->RangeStart <= v && parms->RangeEnd >= v)
					break;
			}
			while (parms[1].RangeStart > parms[0].RangeEnd);

			// Linearly interpolate to find out which color this luminosity level gets.
			int rangev = ((v - parms->RangeStart) << 8) / (parms->RangeEnd - parms->RangeStart);
			int r = ((parms->Start[0] << 8) + rangev * (parms->End[0] - parms->Start[0])) >> 8; // red
			int g = ((parms->Start[1] << 8) + rangev * (parms->End[1] - parms->Start[1])) >> 8; // green
			int b = ((parms->Start[2] << 8) + rangev * (parms->End[2] - parms->Start[2])) >> 8; // blue
			r = clamp(r, 0, 255);
			g = clamp(g, 0, 255);
			b = clamp(b, 0, 255);
			remap.Remap[j] = ColorMatcher.Pick(r, g, b);
			remap.Palette[j] = PalEntry(255,r,g,b);
		}
		Ranges.Push(remap);

		// Advance to the next color range.
		while (parmstart[1].RangeStart > parmstart[0].RangeEnd)
		{
			parmstart++;
		}
		parmstart++;
	}
}